

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Iterator *
leveldb::NewTwoLevelIterator
          (Iterator *index_iter,BlockFunction block_function,void *arg,ReadOptions *options)

{
  Iterator *pIVar1;
  ReadOptions *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  Iterator *unaff_retaddr;
  TwoLevelIterator *in_stack_00000008;
  BlockFunction block_function_00;
  
  block_function_00 = *(BlockFunction *)(in_FS_OFFSET + 0x28);
  pIVar1 = (Iterator *)operator_new(0xb0);
  anon_unknown_7::TwoLevelIterator::TwoLevelIterator
            (in_stack_00000008,unaff_retaddr,block_function_00,in_RDI,in_RSI);
  if (*(BlockFunction *)(in_FS_OFFSET + 0x28) == block_function_00) {
    return pIVar1;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewTwoLevelIterator(Iterator* index_iter,
                              BlockFunction block_function, void* arg,
                              const ReadOptions& options) {
  return new TwoLevelIterator(index_iter, block_function, arg, options);
}